

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int m_uncomp_copy(aec_stream_conflict *strm)

{
  uint *puVar1;
  uint32_t *puVar2;
  internal_state_conflict *piVar3;
  byte *pbVar4;
  uint *puVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  internal_state_conflict *state;
  internal_state_conflict *piVar10;
  
  piVar3 = strm->state;
  uVar6 = strm->bits_per_sample;
  iVar7 = piVar3->bitp;
  piVar10 = piVar3;
  while( true ) {
    if (iVar7 < (int)uVar6) {
      sVar8 = strm->avail_in;
      do {
        sVar8 = sVar8 - 1;
        if (sVar8 == 0xffffffffffffffff) {
          return 0;
        }
        strm->avail_in = sVar8;
        uVar9 = piVar10->acc << 8;
        piVar10->acc = uVar9;
        pbVar4 = strm->next_in;
        strm->next_in = pbVar4 + 1;
        piVar10->acc = *pbVar4 | uVar9;
        iVar7 = iVar7 + 8;
        piVar10->bitp = iVar7;
      } while (iVar7 < (int)uVar6);
    }
    uVar9 = strm->avail_out;
    if (uVar9 < piVar10->bytes_per_sample) break;
    puVar5 = piVar10->rsip;
    puVar1 = puVar5 + 1;
    piVar10->rsip = puVar1;
    *puVar5 = (uint)(piVar10->acc >> ((char)iVar7 - (char)uVar6 & 0x3fU)) &
              (uint)(0xffffffffffffffff >> (-(char)uVar6 & 0x3fU));
    strm->avail_out = uVar9 - piVar10->bytes_per_sample;
    if (piVar10->rsi_size == (long)puVar1 - (long)piVar10->rsi_buffer >> 2) {
      (*piVar10->flush_output)(strm);
      piVar10->flush_start = piVar10->rsi_buffer;
      piVar10->rsip = piVar10->rsi_buffer;
      piVar10 = strm->state;
    }
    uVar6 = strm->bits_per_sample;
    iVar7 = piVar10->bitp - uVar6;
    piVar10->bitp = iVar7;
    puVar2 = &piVar3->i;
    *puVar2 = *puVar2 - 1;
    if (*puVar2 == 0) {
      piVar3->mode = m_id;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int m_uncomp_copy(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    do {
        if (copysample(strm) == 0)
            return M_EXIT;
    } while(--state->i);

    state->mode = m_id;
    return M_CONTINUE;
}